

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_move_val_tag_to_key_tag(Parser *this)

{
  size_t sVar1;
  bool bVar2;
  
  if ((this->m_val_tag).str != (char *)0x0 && (this->m_val_tag).len != 0) {
    bVar2 = _token_is_from_this_line(this,this->m_val_tag);
    if (bVar2) {
      sVar1 = (this->m_val_tag).len;
      (this->m_key_tag).str = (this->m_val_tag).str;
      (this->m_key_tag).len = sVar1;
      this->m_key_tag_indentation = this->m_val_tag_indentation;
      this->m_val_tag_indentation = 0;
      (this->m_val_tag).str = (char *)0x0;
      (this->m_val_tag).len = 0;
    }
  }
  return;
}

Assistant:

C4_ALWAYS_INLINE C4_PURE bool   empty()     const noexcept { return (len == 0 || str == nullptr); }